

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O2

sat_solver * Pdr_ManNewSolver(sat_solver *pSat,Pdr_Man_t *p,int k,int fInit)

{
  Vec_Ptr_t *p_00;
  Aig_Man_t *pAVar1;
  Pdr_Par_t *pPVar2;
  int iVar3;
  int iVar4;
  Cnf_Dat_t *pCVar5;
  Vec_Int_t *pVVar6;
  Aig_Obj_t *pObj;
  long lVar7;
  int nCapMin;
  int iVar8;
  
  if (pSat == (sat_solver *)0x0) {
    __assert_fail("pSat != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/pdr/pdrCnf.c"
                  ,0x1b9,"sat_solver *Pdr_ManNewSolver(sat_solver *, Pdr_Man_t *, int, int)");
  }
  if (p->pPars->fMonoCnf == 0) {
    if (p->pCnf2 == (Cnf_Dat_t *)0x0) {
      pCVar5 = Cnf_DeriveOtherWithMan(p->pCnfMan,p->pAig,0);
      p->pCnf2 = pCVar5;
      pVVar6 = (Vec_Int_t *)calloc((long)p->pAig->vObjs->nSize,0x10);
      p->pvId2Vars = pVVar6;
      Vec_PtrGrow(&p->vVar2Ids,0x100);
    }
    p_00 = &p->vVar2Ids;
    iVar8 = (p->vVar2Ids).nSize;
    if (iVar8 <= k) {
      iVar3 = k + 1;
      iVar4 = p_00->nCap * 2;
      nCapMin = iVar3;
      if ((iVar4 <= k) || (nCapMin = iVar4, p_00->nCap <= k)) {
        Vec_PtrGrow(p_00,nCapMin);
        iVar8 = (p->vVar2Ids).nSize;
      }
      for (lVar7 = (long)iVar8; lVar7 < iVar3; lVar7 = lVar7 + 1) {
        (p->vVar2Ids).pArray[lVar7] = (void *)0x0;
      }
      (p->vVar2Ids).nSize = iVar3;
    }
    pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p_00,k);
    if (pVVar6 == (Vec_Int_t *)0x0) {
      pVVar6 = Vec_IntAlloc(500);
      if ((k < 0) || ((p->vVar2Ids).nSize <= k)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      (p->vVar2Ids).pArray[(uint)k] = pVVar6;
    }
    for (iVar8 = 0; iVar8 < pVVar6->nSize; iVar8 = iVar8 + 1) {
      iVar3 = Vec_IntEntry(pVVar6,iVar8);
      if (iVar3 != -1) {
        iVar4 = Vec_IntEntry(p->pvId2Vars + iVar3,k);
        if (iVar4 < 1) {
          __assert_fail("Vec_IntEntry( p->pvId2Vars + Entry, k ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/pdr/pdrCnf.c"
                        ,0x19e,"sat_solver *Pdr_ManNewSolver2(sat_solver *, Pdr_Man_t *, int, int)")
          ;
        }
        Vec_IntWriteEntry(p->pvId2Vars + iVar3,k,0);
      }
    }
    pVVar6->nSize = 0;
    Vec_IntPush(pVVar6,-1);
    sat_solver_setnvars(pSat,500);
  }
  else {
    pCVar5 = p->pCnf1;
    if (pCVar5 == (Cnf_Dat_t *)0x0) {
      pAVar1 = p->pAig;
      iVar8 = pAVar1->nRegs;
      iVar3 = pAVar1->nObjs[3];
      pAVar1->nRegs = iVar3;
      pCVar5 = Cnf_DeriveWithMan(p->pCnfMan,pAVar1,iVar3);
      p->pCnf1 = pCVar5;
      p->pAig->nRegs = iVar8;
      if (p->vVar2Reg != (Vec_Int_t *)0x0) {
        __assert_fail("p->vVar2Reg == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/pdr/pdrCnf.c"
                      ,0x16e,"sat_solver *Pdr_ManNewSolver1(sat_solver *, Pdr_Man_t *, int, int)");
      }
      iVar8 = pCVar5->nVars;
      pVVar6 = Vec_IntAlloc(iVar8);
      pVVar6->nSize = iVar8;
      if (pVVar6->pArray != (int *)0x0) {
        memset(pVVar6->pArray,0xff,(long)iVar8 << 2);
      }
      p->vVar2Reg = pVVar6;
      for (iVar8 = 0; pAVar1 = p->pAig, iVar8 < pAVar1->nRegs; iVar8 = iVar8 + 1) {
        pObj = (Aig_Obj_t *)Vec_PtrEntry(pAVar1->vCos,pAVar1->nTruePos + iVar8);
        pVVar6 = p->vVar2Reg;
        iVar3 = Pdr_ObjSatVar(p,k,3,pObj);
        Vec_IntWriteEntry(pVVar6,iVar3,iVar8);
      }
      pCVar5 = p->pCnf1;
    }
    pSat = (sat_solver *)Cnf_DataWriteIntoSolverInt(pSat,pCVar5,1,fInit);
  }
  pSat->nRuntimeLimit = p->timeToStop;
  pPVar2 = p->pPars;
  pSat->RunId = pPVar2->RunId;
  pSat->pFuncStop = pPVar2->pFuncStop;
  return pSat;
}

Assistant:

sat_solver * Pdr_ManNewSolver( sat_solver * pSat, Pdr_Man_t * p, int k, int fInit )
{
    assert( pSat != NULL );
    if ( p->pPars->fMonoCnf )
        return Pdr_ManNewSolver1( pSat, p, k, fInit );
    else
        return Pdr_ManNewSolver2( pSat, p, k, fInit );
}